

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

uint8_t * __thiscall
cdns_query::parse_map_item(cdns_query *this,uint8_t *old_in,uint8_t *in_max,int64_t val,int *err)

{
  cdns *pcVar1;
  uint8_t *puVar2;
  int *v;
  int is_signed;
  cdns_qr_extended *v_00;
  
  pcVar1 = this->current_block->current_cdns;
  if ((pcVar1->preamble_parsed == true) && ((pcVar1->preamble).cdns_version_major == 0)) {
    puVar2 = parse_map_item_old(this,old_in,in_max,val,err);
    return puVar2;
  }
  switch(val) {
  case 0:
    v = &this->time_offset_usec;
    goto LAB_00157df7;
  case 1:
    v = &this->client_address_index;
    break;
  case 2:
    v = &this->client_port;
    break;
  case 3:
    v = &this->transaction_id;
    break;
  case 4:
    v = &this->query_signature_index;
    break;
  case 5:
    v = &this->client_hoplimit;
    break;
  case 6:
    v = &this->delay_useconds;
LAB_00157df7:
    is_signed = 1;
    goto LAB_00157e31;
  case 7:
    v = &this->query_name_index;
    break;
  case 8:
    v = &this->query_size;
    break;
  case 9:
    v = &this->response_size;
    break;
  case 10:
    (this->rpd).is_present = true;
    puVar2 = cbor_map_parse<cdns_response_processing_data>(old_in,in_max,&this->rpd,err);
    goto LAB_00157e39;
  case 0xb:
    v_00 = &this->q_extended;
    if ((this->q_extended).is_filled == true) {
      v_00->question_index = -1;
      (this->q_extended).answer_index = -1;
      (this->q_extended).authority_index = -1;
      (this->q_extended).additional_index = -1;
    }
    (this->q_extended).is_filled = true;
    goto LAB_00157dac;
  case 0xc:
    v_00 = &this->r_extended;
    if ((this->r_extended).is_filled == true) {
      v_00->question_index = -1;
      (this->r_extended).answer_index = -1;
      (this->r_extended).authority_index = -1;
      (this->r_extended).additional_index = -1;
    }
    (this->r_extended).is_filled = true;
LAB_00157dac:
    puVar2 = cbor_map_parse<cdns_qr_extended>(old_in,in_max,v_00,err);
    goto LAB_00157e39;
  default:
    puVar2 = cbor_skip(old_in,in_max,err);
    goto LAB_00157e39;
  }
  is_signed = 0;
LAB_00157e31:
  puVar2 = cbor_parse_int(old_in,in_max,v,is_signed,err);
LAB_00157e39:
  if (puVar2 == (uint8_t *)0x0) {
    puVar2 = (uint8_t *)0x0;
    fprintf(_stderr,"\nError %d parsing query field type %d\n",(ulong)(uint)*err,val & 0xffffffff);
  }
  return puVar2;
}

Assistant:

uint8_t* cdns_query::parse_map_item(uint8_t* old_in, uint8_t const* in_max, int64_t val, int* err)
{
    uint8_t* in = old_in;

    if (current_block->current_cdns->is_old_version()) {
        in = parse_map_item_old(in, in_max, val, err);
    }
    else {
        switch (val) {
        case 0: // time_useconds
            in = cbor_parse_int(in, in_max, &time_offset_usec, 1, err);
            break;
        case 1: // client_address_index
            in = cbor_parse_int(in, in_max, &client_address_index, 0, err);
            break;
        case 2: // client_port,
            in = cbor_parse_int(in, in_max, &client_port, 0, err);
            break;
        case 3: // transaction_id
            in = cbor_parse_int(in, in_max, &transaction_id, 0, err);
            break;
        case 4: // query_signature_index
            in = cbor_parse_int(in, in_max, &query_signature_index, 0, err);
            break;
        case 5: // client_hoplimit
            in = cbor_parse_int(in, in_max, &client_hoplimit, 0, err);
            break;
        case 6: // delay_useconds
            in = cbor_parse_int(in, in_max, &delay_useconds, 1, err);
            break;
        case 7: // query_name_index
            in = cbor_parse_int(in, in_max, &query_name_index, 0, err);
            break;
        case 8: // query_size
            in = cbor_parse_int(in, in_max, &query_size, 0, err);
            break;
        case 9: // response_size
            in = cbor_parse_int(in, in_max, &response_size, 0, err);
            break;
        case 10: // ResponseProcessingData
            in = rpd.parse(in, in_max, err);
            break;
        case 11: // query_extended
            in = q_extended.parse(in, in_max, err);
            break;
        case 12: // response_extended,\n");
            in = r_extended.parse(in, in_max, err);
            break;
        default:
            /* TODO: something */
            in = cbor_skip(in, in_max, err);
            break;
        }

        if (in == NULL) {
            fprintf(stderr, "\nError %d parsing query field type %d\n", *err, (int)val);
        }
    }

    return in;
}